

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O3

bool __thiscall ProString::startsWith(ProString *this,QChar c,CaseSensitivity cs)

{
  undefined1 uVar1;
  CutResult CVar2;
  char16_t *pcVar3;
  long lVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  long local_30;
  long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = (this->m_string).d.ptr;
  local_28 = (long)this->m_offset;
  local_30 = (long)this->m_length;
  CVar2 = QtPrivate::QContainerImplHelper::mid((this->m_string).d.size,&local_28,&local_30);
  if (CVar2 == Null) {
    lVar4 = 0;
    pcVar3 = (char16_t *)0x0;
  }
  else {
    pcVar3 = pcVar3 + local_28;
    lVar4 = local_30;
  }
  local_28 = CONCAT62(local_28._2_6_,c.ucs);
  QVar5.m_data = pcVar3;
  QVar5.m_size = lVar4;
  QVar6.m_data = (storage_type_conflict *)&local_28;
  QVar6.m_size = 1;
  uVar1 = QtPrivate::startsWith(QVar5,QVar6,cs);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (bool)uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool startsWith(QChar c, Qt::CaseSensitivity cs = Qt::CaseSensitive) const { return toQStringView().startsWith(c, cs); }